

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

bool __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
parse_set_delimiter_tag
          (parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                 *contents,
          delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *delimiter_set)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__range3;
  bool bVar4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> begin;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> contents_substr;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> end;
  long *local_88;
  long local_80;
  long local_78 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if ((contents->_M_string_length < 5) ||
     ((contents->_M_dataplus)._M_p[contents->_M_string_length - 1] != L'=')) {
    return false;
  }
  std::__cxx11::wstring::substr((ulong)&local_88,(ulong)contents);
  trim<std::__cxx11::wstring>(&local_68,(mustache *)&local_88,s);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] * 4 + 4);
  }
  bVar4 = false;
  lVar3 = std::__cxx11::wstring::find((wchar_t)&local_68,0x20);
  if (lVar3 == -1) goto LAB_001e2690;
  lVar3 = std::__cxx11::wstring::find_first_not_of((wchar_t)&local_68,0x20);
  if (lVar3 == -1) {
    __assert_fail("nonspace != string_type::npos",
                  "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp"
                  ,0x33c,
                  "bool kainjow::mustache::parser<std::basic_string<wchar_t>>::parse_set_delimiter_tag(const string_type &, delimiter_set<string_type> &) const [string_type = std::basic_string<wchar_t>]"
                 );
  }
  std::__cxx11::wstring::substr((ulong)&local_88,(ulong)&local_68);
  std::__cxx11::wstring::substr((ulong)&local_48,(ulong)&local_68);
  plVar1 = local_88;
  if (local_80 != 0) {
    lVar3 = 0;
    do {
      if ((*(int *)((long)plVar1 + lVar3) == 0x3d) ||
         (iVar2 = isspace(*(int *)((long)plVar1 + lVar3)), iVar2 != 0)) goto LAB_001e2652;
      lVar3 = lVar3 + 4;
    } while (local_80 << 2 != lVar3);
  }
  plVar1 = local_48;
  if (local_40 != 0) {
    lVar3 = 0;
    do {
      if ((*(int *)((long)plVar1 + lVar3) == 0x3d) ||
         (iVar2 = isspace(*(int *)((long)plVar1 + lVar3)), iVar2 != 0)) goto LAB_001e2652;
      lVar3 = lVar3 + 4;
    } while (local_40 << 2 != lVar3);
  }
  std::__cxx11::wstring::_M_assign((wstring *)delimiter_set);
  bVar4 = true;
  std::__cxx11::wstring::_M_assign((wstring *)&delimiter_set->end);
LAB_001e2655:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] * 4 + 4);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] * 4 + 4);
  }
LAB_001e2690:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
  }
  return bVar4;
LAB_001e2652:
  bVar4 = false;
  goto LAB_001e2655;
}

Assistant:

stream_type& render(basic_context<string_type>& ctx, stream_type& stream) {
        context_internal<string_type> context{ctx};
        render([&stream](const string_type& str) {
            stream << str;
        }, context);
        return stream;
    }